

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

char string_buffer_pop_back(string_buffer_t *sb)

{
  char cVar1;
  size_t sVar2;
  
  if (sb == (string_buffer_t *)0x0) {
    __assert_fail("sb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x161,"char string_buffer_pop_back(string_buffer_t *)");
  }
  sVar2 = sb->size;
  if (sVar2 != 0) {
    sb->size = sVar2 - 1;
    cVar1 = sb->s[sVar2 - 1];
    sb->s[sVar2 - 1] = '\0';
    return cVar1;
  }
  return '\0';
}

Assistant:

char string_buffer_pop_back(string_buffer_t *sb) {
    assert(sb != NULL);
    if (sb->size == 0)
        return 0;

    char back = sb->s[--sb->size];
    sb->s[sb->size] = 0;
    return back;
}